

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11disp.c
# Opt level: O0

X11Display * x11_setup_display(char *display,Conf *conf,char **error_msg)

{
  _Bool _Var1;
  int iVar2;
  X11Display *display_00;
  SockAddr *pSVar3;
  char *pcVar4;
  SockAddr *cmp;
  _STACK *s_00;
  char *__s;
  byte local_89;
  char *local_88;
  Socket *s;
  char *err_1;
  SockAddr *ux;
  char *err;
  char *hostname;
  char *protocol;
  char *slash;
  char *dot;
  char *colon;
  char *localcopy;
  X11Display *disp;
  char **error_msg_local;
  Conf *conf_local;
  char *display_local;
  
  display_00 = (X11Display *)safemalloc(1,0x50,0);
  *error_msg = (char *)0x0;
  if ((display == (char *)0x0) || (*display == '\0')) {
    colon = platform_get_x_display();
    if ((colon == (char *)0x0) || (*colon == '\0')) {
      safefree(colon);
      colon = dupstr(":0");
    }
  }
  else {
    colon = dupstr(display);
  }
  if (*colon == '/') {
    display_00->unixsocketpath = colon;
    display_00->unixdomain = true;
    display_00->hostname = (char *)0x0;
    display_00->displaynum = -1;
    display_00->screennum = 0;
    display_00->addr = (SockAddr *)0x0;
  }
  else {
    pcVar4 = host_strrchr(colon,0x3a);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = dupprintf("display name \'%s\' has no \':number\' suffix",colon);
      *error_msg = pcVar4;
      safefree(display_00);
      safefree(colon);
      return (X11Display *)0x0;
    }
    __s = pcVar4 + 1;
    *pcVar4 = '\0';
    pcVar4 = strchr(__s,0x2e);
    slash = pcVar4;
    if (pcVar4 != (char *)0x0) {
      slash = pcVar4 + 1;
      *pcVar4 = '\0';
    }
    iVar2 = atoi(__s);
    display_00->displaynum = iVar2;
    if (slash == (char *)0x0) {
      display_00->screennum = 0;
    }
    else {
      iVar2 = atoi(slash);
      display_00->screennum = iVar2;
    }
    hostname = (char *)0x0;
    err = colon;
    if ((colon < __s) && (pcVar4 = strchr(colon,0x2f), pcVar4 != (char *)0x0)) {
      err = pcVar4 + 1;
      *pcVar4 = '\0';
      hostname = colon;
    }
    if (*err == '\0') {
      local_88 = (char *)0x0;
    }
    else {
      local_88 = dupstr(err);
    }
    display_00->hostname = local_88;
    if (hostname == (char *)0x0) {
      if ((*err == '\0') || (iVar2 = strcmp(err,"unix"), iVar2 == 0)) {
        display_00->unixdomain = true;
      }
      else {
        display_00->unixdomain = false;
      }
    }
    else {
      iVar2 = strcmp(hostname,"local");
      local_89 = 1;
      if (iVar2 != 0) {
        iVar2 = strcmp(hostname,"unix");
        local_89 = iVar2 != 0 ^ 0xff;
      }
      display_00->unixdomain = (_Bool)(local_89 & 1);
    }
    if ((display_00->hostname == (char *)0x0) && ((display_00->unixdomain & 1U) == 0)) {
      pcVar4 = dupstr("localhost");
      display_00->hostname = pcVar4;
    }
    display_00->unixsocketpath = (char *)0x0;
    display_00->addr = (SockAddr *)0x0;
    safefree(colon);
  }
  if ((display_00->unixdomain & 1U) == 0) {
    display_00->port = display_00->displaynum + 6000;
    pSVar3 = name_lookup(display_00->hostname,display_00->port,&display_00->realhost,conf,0,
                         (LogContext *)0x0,(char *)0x0);
    display_00->addr = pSVar3;
    pcVar4 = sk_addr_error(display_00->addr);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = dupprintf("unable to resolve host name \'%s\' in display name",display_00->hostname);
      *error_msg = pcVar4;
      sk_addr_free(display_00->addr);
      safefree(display_00->hostname);
      safefree(display_00->unixsocketpath);
      safefree(display_00);
      return (X11Display *)0x0;
    }
  }
  if (((display_00->unixdomain & 1U) == 0) && (_Var1 = sk_address_is_local(display_00->addr), _Var1)
     ) {
    pSVar3 = platform_get_x11_unix_address((char *)0x0,display_00->displaynum);
    s = (Socket *)sk_addr_error(pSVar3);
    if (s == (Socket *)0x0) {
      cmp = sk_addr_dup(pSVar3);
      s_00 = sk_new((cmp *)cmp);
      s = (Socket *)sk_socket_error((Socket *)s_00);
      sk_close((Socket *)s_00);
    }
    if (s == (Socket *)0x0) {
      sk_addr_free(display_00->addr);
      display_00->unixdomain = true;
      display_00->addr = pSVar3;
    }
    else {
      sk_addr_free(pSVar3);
    }
  }
  if ((display_00->unixdomain & 1U) != 0) {
    if (display_00->addr == (SockAddr *)0x0) {
      pSVar3 = platform_get_x11_unix_address(display_00->unixsocketpath,display_00->displaynum);
      display_00->addr = pSVar3;
    }
    if (display_00->unixsocketpath == (char *)0x0) {
      pcVar4 = dupprintf("unix:%d",(ulong)(uint)display_00->displaynum);
      display_00->realhost = pcVar4;
    }
    else {
      pcVar4 = dupstr(display_00->unixsocketpath);
      display_00->realhost = pcVar4;
    }
    display_00->port = 0;
  }
  display_00->localauthproto = 0;
  display_00->localauthdata = (uchar *)0x0;
  display_00->localauthdatalen = 0;
  platform_get_x11_auth(display_00,conf);
  return display_00;
}

Assistant:

struct X11Display *x11_setup_display(const char *display, Conf *conf,
                                     char **error_msg)
{
    struct X11Display *disp = snew(struct X11Display);
    char *localcopy;

    *error_msg = NULL;

    if (!display || !*display) {
        localcopy = platform_get_x_display();
        if (!localcopy || !*localcopy) {
            sfree(localcopy);
            localcopy = dupstr(":0");  /* plausible default for any platform */
        }
    } else
        localcopy = dupstr(display);

    /*
     * Parse the display name.
     *
     * We expect this to have one of the following forms:
     *
     *  - the standard X format which looks like
     *    [ [ protocol '/' ] host ] ':' displaynumber [ '.' screennumber ]
     *    (X11 also permits a double colon to indicate DECnet, but
     *    that's not our problem, thankfully!)
     *
     *  - only seen in the wild on MacOS (so far): a pathname to a
     *    Unix-domain socket, which will typically and confusingly
     *    end in ":0", and which I'm currently distinguishing from
     *    the standard scheme by noting that it starts with '/'.
     */
    if (localcopy[0] == '/') {
        disp->unixsocketpath = localcopy;
        disp->unixdomain = true;
        disp->hostname = NULL;
        disp->displaynum = -1;
        disp->screennum = 0;
        disp->addr = NULL;
    } else {
        char *colon, *dot, *slash;
        char *protocol, *hostname;

        colon = host_strrchr(localcopy, ':');
        if (!colon) {
            *error_msg = dupprintf("display name '%s' has no ':number'"
                                   " suffix", localcopy);

            sfree(disp);
            sfree(localcopy);
            return NULL;
        }

        *colon++ = '\0';
        dot = strchr(colon, '.');
        if (dot)
            *dot++ = '\0';

        disp->displaynum = atoi(colon);
        if (dot)
            disp->screennum = atoi(dot);
        else
            disp->screennum = 0;

        protocol = NULL;
        hostname = localcopy;
        if (colon > localcopy) {
            slash = strchr(localcopy, '/');
            if (slash) {
                *slash++ = '\0';
                protocol = localcopy;
                hostname = slash;
            }
        }

        disp->hostname = *hostname ? dupstr(hostname) : NULL;

        if (protocol)
            disp->unixdomain = (!strcmp(protocol, "local") ||
                                !strcmp(protocol, "unix"));
        else if (!*hostname || !strcmp(hostname, "unix"))
            disp->unixdomain = platform_uses_x11_unix_by_default;
        else
            disp->unixdomain = false;

        if (!disp->hostname && !disp->unixdomain)
            disp->hostname = dupstr("localhost");

        disp->unixsocketpath = NULL;
        disp->addr = NULL;

        sfree(localcopy);
    }

    /*
     * Look up the display hostname, if we need to.
     */
    if (!disp->unixdomain) {
        const char *err;

        disp->port = 6000 + disp->displaynum;
        disp->addr = name_lookup(disp->hostname, disp->port,
                                 &disp->realhost, conf, ADDRTYPE_UNSPEC,
                                 NULL, NULL);

        if ((err = sk_addr_error(disp->addr)) != NULL) {
            *error_msg = dupprintf("unable to resolve host name '%s' in "
                                   "display name", disp->hostname);

            sk_addr_free(disp->addr);
            sfree(disp->hostname);
            sfree(disp->unixsocketpath);
            sfree(disp);
            return NULL;
        }
    }

    /*
     * Try upgrading an IP-style localhost display to a Unix-socket
     * display (as the standard X connection libraries do).
     */
    if (!disp->unixdomain && sk_address_is_local(disp->addr)) {
        SockAddr *ux = platform_get_x11_unix_address(NULL, disp->displaynum);
        const char *err = sk_addr_error(ux);
        if (!err) {
            /* Create trial connection to see if there is a useful Unix-domain
             * socket */
            Socket *s = sk_new(sk_addr_dup(ux), 0, false, false,
                               false, false, nullplug);
            err = sk_socket_error(s);
            sk_close(s);
        }
        if (err) {
            sk_addr_free(ux);
        } else {
            sk_addr_free(disp->addr);
            disp->unixdomain = true;
            disp->addr = ux;
            /* Fill in the rest in a moment */
        }
    }

    if (disp->unixdomain) {
        if (!disp->addr)
            disp->addr = platform_get_x11_unix_address(disp->unixsocketpath,
                                                       disp->displaynum);
        if (disp->unixsocketpath)
            disp->realhost = dupstr(disp->unixsocketpath);
        else
            disp->realhost = dupprintf("unix:%d", disp->displaynum);
        disp->port = 0;
    }

    /*
     * Fetch the local authorisation details.
     */
    disp->localauthproto = X11_NO_AUTH;
    disp->localauthdata = NULL;
    disp->localauthdatalen = 0;
    platform_get_x11_auth(disp, conf);

    return disp;
}